

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.cpp
# Opt level: O1

bool __thiscall
tonk::ConnectionAddrMap::ChangeAddress
          (ConnectionAddrMap *this,UDPAddress *oldAddress,UDPAddress *newAddress,
          IConnection *connection)

{
  int iVar1;
  insert_result iVar2;
  bool bVar3;
  bool bVar4;
  IConnection *local_30;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->AddressMapLock);
  if (iVar1 == 0) {
    if (this->RecentConnection == connection) {
      (this->RecentAddress).impl_.data_.base.sa_family = 2;
      *(undefined1 (*) [16])((long)&(this->RecentAddress).impl_.data_ + 2) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)&(this->RecentAddress).impl_.data_.v6.sin6_addr.__in6_u + 4) =
           (undefined1  [16])0x0;
      this->RecentConnection = (IConnection *)0x0;
    }
    if ((oldAddress->impl_).data_.base.sa_family == 2) {
      bVar4 = (oldAddress->impl_).data_.v6.sin6_flowinfo == 0;
    }
    else {
      bVar4 = (oldAddress->impl_).data_.v6.sin6_addr.__in6_u ==
              (anon_union_16_3_a3f0114d_for___in6_u)0x0;
    }
    if (!bVar4) {
      ConnectionMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::UDPAddressHasher>::Remove
                (&this->AddressMap,oldAddress,connection);
    }
    if ((newAddress->impl_).data_.base.sa_family == 2) {
      bVar4 = (newAddress->impl_).data_.v6.sin6_flowinfo == 0;
    }
    else {
      bVar4 = (newAddress->impl_).data_.v6.sin6_addr.__in6_u ==
              (anon_union_16_3_a3f0114d_for___in6_u)0x0;
    }
    bVar3 = true;
    if (!bVar4) {
      local_30 = connection;
      iVar2 = LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
              ::insert(&(this->AddressMap).TheMap,newAddress,&local_30);
      bVar3 = (bool)(iVar2.second & 1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->AddressMapLock);
    return bVar3;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

bool ConnectionAddrMap::ChangeAddress(
    const UDPAddress& oldAddress,
    const UDPAddress& newAddress,
    IConnection* connection)
{
    Locker locker(AddressMapLock);

    // Remove from recent list
    if (RecentConnection == connection)
    {
        RecentAddress = UDPAddress();
        RecentConnection = nullptr;
    }

    if (!oldAddress.address().is_unspecified()) {
        AddressMap.Remove(oldAddress, connection);
    }
    if (!newAddress.address().is_unspecified()) {
        return AddressMap.Insert(newAddress, connection);
    }

    // If new address is unspecified, return true
    return true;
}